

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::SingleVertexArrayUsageGroup::SingleVertexArrayUsageGroup
          (SingleVertexArrayUsageGroup *this,Context *context,Usage usage)

{
  char *description;
  undefined1 auVar1 [12];
  string local_60;
  string local_40;
  Usage local_1c;
  Context *pCStack_18;
  Usage usage_local;
  Context *context_local;
  SingleVertexArrayUsageGroup *this_local;
  
  local_1c = usage;
  pCStack_18 = context;
  context_local = (Context *)this;
  deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_40,(Array *)(ulong)usage,usage);
  auVar1 = std::__cxx11::string::c_str();
  deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_60,(Array *)(ulong)local_1c,auVar1._8_4_);
  description = (char *)std::__cxx11::string::c_str();
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,context,auVar1._0_8_,description);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleVertexArrayUsageGroup_0159a118;
  this->m_usage = local_1c;
  return;
}

Assistant:

SingleVertexArrayUsageGroup::SingleVertexArrayUsageGroup (Context& context, Array::Usage usage)
	: TestCaseGroup	(context, Array::usageTypeToString(usage).c_str(), Array::usageTypeToString(usage).c_str())
	, m_usage		(usage)
{
}